

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void process_xm_note_data(DUMB_IT_SIGRENDERER *sigrenderer,IT_ENTRY *entry)

{
  byte bVar1;
  unsigned_short uVar2;
  DUMB_IT_SIGDATA *sigdata_00;
  uchar uVar3;
  uint uVar4;
  IT_CHANNEL *channel_00;
  IT_PLAYING *pIVar5;
  byte *in_RSI;
  DUMB_IT_SIGRENDERER *in_RDI;
  int value;
  int effect;
  uchar v_1;
  uchar v;
  IT_INSTRUMENT *instrument;
  IT_PLAYING *playing_1;
  IT_PLAYING *ptemp;
  int i_2;
  int i_1;
  int i;
  int oldsample;
  IT_PLAYING *playing;
  IT_CHANNEL *channel;
  DUMB_IT_SIGDATA *sigdata;
  DUMB_IT_SIGRENDERER *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  char cVar6;
  undefined4 in_stack_ffffffffffffff94;
  IT_PLAYING *in_stack_ffffffffffffff98;
  int32 pos;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  byte local_52;
  byte local_51;
  IT_PLAYING *local_40;
  int local_38;
  int local_34;
  int local_30;
  IT_PLAYING *local_28;
  
  sigdata_00 = in_RDI->sigdata;
  channel_00 = in_RDI->channel + (int)(uint)*in_RSI;
  local_28 = (IT_PLAYING *)0x0;
  if ((in_RSI[1] & 2) != 0) {
    uVar2 = channel_00->sample;
    channel_00->inv_loop_offset = 0;
    channel_00->instrument = in_RSI[3];
    instrument_to_sample(sigdata_00,channel_00);
    if (((channel_00->playing != (IT_PLAYING *)0x0) &&
        (((in_RSI[1] & 1) == 0 || (in_RSI[2] < 0x78)))) &&
       (((in_RSI[1] & 8) == 0 || ((in_RSI[5] != 0x20 || (in_RSI[6] != 0)))))) {
      local_28 = dup_playing(in_stack_ffffffffffffff98,
                             (IT_CHANNEL *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             (IT_CHANNEL *)in_stack_ffffffffffffff88);
      if (local_28 == (IT_PLAYING *)0x0) {
        return;
      }
      if ((sigdata_00->flags & 0x80U) == 0) {
        channel_00->playing->flags = channel_00->playing->flags & 0xfffffff9;
        it_playing_update_resamplers(channel_00->playing);
        channel_00->volume = channel_00->playing->sample->default_volume;
        channel_00->truepan = (ushort)channel_00->playing->sample->default_pan * 0x40 + 0x20;
        retrigger_xm_envelopes(channel_00->playing);
      }
      else {
        if (uVar2 != channel_00->sample) {
          for (local_30 = 0; local_30 < 0xc0; local_30 = local_30 + 1) {
            if (in_RDI->playing[local_30] == (IT_PLAYING *)0x0) {
              channel_00->playing->declick_stage = '\x03';
              in_RDI->playing[local_30] = channel_00->playing;
              channel_00->playing = (IT_PLAYING *)0x0;
              break;
            }
          }
          if (channel_00->sample == 0) {
            if (channel_00->playing != (IT_PLAYING *)0x0) {
              free_playing(in_RDI,channel_00->playing);
              channel_00->playing = (IT_PLAYING *)0x0;
            }
          }
          else {
            if (channel_00->playing != (IT_PLAYING *)0x0) {
              free_playing(in_RDI,channel_00->playing);
            }
            channel_00->playing = local_28;
            local_28 = (IT_PLAYING *)0x0;
            channel_00->playing->declick_stage = '\0';
            channel_00->playing->sampnum = channel_00->sample;
            channel_00->playing->sample = sigdata_00->sample + (int)(channel_00->sample - 1);
            it_playing_reset_resamplers
                      ((IT_PLAYING *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (int32)((ulong)in_stack_ffffffffffffff98 >> 0x20));
          }
        }
        get_default_volpan(sigdata_00,channel_00);
      }
    }
  }
  pos = (int32)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (((((in_RSI[1] & 8) == 0) || (in_RSI[5] != 0x20)) || (in_RSI[6] != 0)) &&
     ((in_RSI[1] & 1) != 0)) {
    if ((in_RSI[1] & 2) == 0) {
      instrument_to_sample(sigdata_00,channel_00);
    }
    if (channel_00->note < 0x78) {
      if (channel_00->sample == 0) {
        if (channel_00->playing != (IT_PLAYING *)0x0) {
          if (local_28 != (IT_PLAYING *)0x0) {
            free_playing(in_RDI,channel_00->playing);
            channel_00->playing = local_28;
            local_28 = (IT_PLAYING *)0x0;
          }
          for (local_34 = 0; local_34 < 0xc0; local_34 = local_34 + 1) {
            if (in_RDI->playing[local_34] == (IT_PLAYING *)0x0) {
              channel_00->playing->declick_stage = '\x03';
              in_RDI->playing[local_34] = channel_00->playing;
              channel_00->playing = (IT_PLAYING *)0x0;
              break;
            }
          }
          if (channel_00->playing != (IT_PLAYING *)0x0) {
            free_playing(in_RDI,channel_00->playing);
            channel_00->playing = (IT_PLAYING *)0x0;
          }
        }
        if (local_28 == (IT_PLAYING *)0x0) {
          return;
        }
        free_playing(in_RDI,local_28);
        return;
      }
      if ((((channel_00->playing == (IT_PLAYING *)0x0) || ((in_RSI[1] & 4) == 0)) ||
          ((int)(uint)in_RSI[4] >> 4 != 0xf)) &&
         (((channel_00->playing == (IT_PLAYING *)0x0 || ((in_RSI[1] & 8) == 0)) ||
          ((in_RSI[5] != 7 && (in_RSI[5] != 0xc)))))) {
        channel_00->destnote = 0xff;
        if (channel_00->playing == (IT_PLAYING *)0x0) {
          pIVar5 = new_playing(in_stack_ffffffffffffff88);
          channel_00->playing = pIVar5;
          if (channel_00->playing == (IT_PLAYING *)0x0) {
            if (local_28 == (IT_PLAYING *)0x0) {
              return;
            }
            free_playing(in_RDI,local_28);
            return;
          }
          retrigger_xm_envelopes(channel_00->playing);
        }
        else if (local_28 != (IT_PLAYING *)0x0) {
          if (local_28->sample == (IT_SAMPLE *)0x0) {
            local_40 = channel_00->playing;
          }
          else {
            local_40 = local_28;
          }
          if (local_40 == (IT_PLAYING *)0x0) {
            if (local_28 == (IT_PLAYING *)0x0) {
              return;
            }
            free_playing(in_RDI,local_28);
            return;
          }
          local_28 = (IT_PLAYING *)0x0;
          for (local_38 = 0; local_38 < 0xc0; local_38 = local_38 + 1) {
            if (in_RDI->playing[local_38] == (IT_PLAYING *)0x0) {
              local_40->declick_stage = '\x03';
              local_40->flags = local_40->flags | 6;
              in_RDI->playing[local_38] = local_40;
              local_40 = (IT_PLAYING *)0x0;
              break;
            }
          }
          if (local_40 != (IT_PLAYING *)0x0) {
            free_playing(in_RDI,local_40);
          }
        }
        channel_00->playing->flags = 0;
        channel_00->playing->resampling_quality = in_RDI->resampling_quality;
        channel_00->playing->channel = channel_00;
        channel_00->playing->sample = sigdata_00->sample + (int)(channel_00->sample - 1);
        if ((sigdata_00->flags & 4U) == 0) {
          channel_00->playing->instrument = (IT_INSTRUMENT *)0x0;
        }
        else {
          channel_00->playing->instrument =
               sigdata_00->instrument + (int)(channel_00->instrument - 1);
        }
        channel_00->playing->env_instrument = channel_00->playing->instrument;
        channel_00->playing->sampnum = channel_00->sample;
        channel_00->playing->instnum = channel_00->instrument;
        channel_00->playing->declick_stage = '\0';
        channel_00->playing->channel_volume = channel_00->channelvolume;
        channel_00->playing->note = channel_00->truenote;
        channel_00->playing->enabled_envelopes = '\0';
        channel_00->playing->volume_offset = '\0';
        channel_00->playing->panning_offset = '\0';
        if ((sigdata_00->flags & 4U) != 0) {
          pIVar5 = channel_00->playing;
          if (((pIVar5->instrument->volume_envelope).flags & 1) != 0) {
            pIVar5->enabled_envelopes = pIVar5->enabled_envelopes | 1;
          }
          if (((pIVar5->instrument->pan_envelope).flags & 1) != 0) {
            pIVar5->enabled_envelopes = pIVar5->enabled_envelopes | 2;
          }
        }
        channel_00->playing->filter_cutoff = '\x7f';
        channel_00->playing->filter_resonance = '\0';
        channel_00->playing->true_filter_cutoff = 0x7f00;
        channel_00->playing->true_filter_resonance = '\0';
        channel_00->playing->vibrato_speed = '\0';
        channel_00->playing->vibrato_depth = '\0';
        channel_00->playing->vibrato_n = '\0';
        channel_00->playing->vibrato_time = '\0';
        channel_00->playing->vibrato_waveform = '\0';
        channel_00->playing->tremolo_speed = '\0';
        channel_00->playing->tremolo_depth = '\0';
        channel_00->playing->tremolo_time = '\0';
        channel_00->playing->tremolo_waveform = '\0';
        channel_00->playing->panbrello_speed = '\0';
        channel_00->playing->panbrello_depth = '\0';
        channel_00->playing->panbrello_time = '\0';
        channel_00->playing->panbrello_waveform = '\0';
        channel_00->playing->panbrello_random = '\0';
        channel_00->playing->sample_vibrato_time = '\0';
        channel_00->playing->sample_vibrato_waveform = channel_00->playing->sample->vibrato_waveform
        ;
        channel_00->playing->sample_vibrato_depth = 0;
        channel_00->playing->slide = 0;
        channel_00->playing->finetune = (int)channel_00->playing->sample->finetune;
        it_reset_filter_state(channel_00->playing->filter_state);
        it_reset_filter_state(channel_00->playing->filter_state + 1);
        it_playing_reset_resamplers
                  ((IT_PLAYING *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),pos);
      }
    }
    else {
      xm_note_off((DUMB_IT_SIGDATA *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (IT_CHANNEL *)in_stack_ffffffffffffff88);
    }
  }
  if ((((((in_RSI[1] & 8) == 0) || (in_RSI[5] != 0x20)) || (in_RSI[6] != 0)) &&
      (((in_RSI[1] & 1) == 0 || (in_RSI[2] < 0x78)))) && ((in_RSI[1] & 3) == 3)) {
    if (channel_00->playing != (IT_PLAYING *)0x0) {
      retrigger_xm_envelopes(channel_00->playing);
    }
    get_default_volpan(sigdata_00,channel_00);
  }
  if (((in_RSI[1] & 4) == 0) || ((int)(uint)in_RSI[4] >> 4 != 0xf)) {
    if (((in_RSI[1] & 8) != 0) && ((in_RSI[5] == 7 || (in_RSI[5] == 0xc)))) {
      if (in_RSI[5] == 7) {
        local_52 = in_RSI[6];
      }
      else {
        local_52 = 0;
      }
      if (local_52 == 0) {
        local_52 = channel_00->lastG;
      }
      channel_00->lastG = local_52;
      if ((((in_RSI[1] & 1) != 0) && (channel_00->sample != 0)) && (channel_00->note < 0x78)) {
        channel_00->destnote = channel_00->truenote;
      }
      channel_00->toneporta = (uint)local_52 << 4;
    }
  }
  else {
    local_51 = in_RSI[4] << 4;
    if (local_51 == 0) {
      local_51 = channel_00->lastG;
    }
    channel_00->lastG = local_51;
    if ((((in_RSI[1] & 1) != 0) && (channel_00->sample != 0)) && (channel_00->note < 0x78)) {
      channel_00->destnote = channel_00->truenote;
    }
    channel_00->toneporta = (uint)local_51 << 4;
  }
  if ((in_RSI[1] & 4) != 0) {
    bVar1 = in_RSI[4];
    uVar4 = bVar1 & 0xf;
    uVar3 = (uchar)uVar4;
    switch(in_RSI[4] >> 4) {
    case 6:
      channel_00->xm_volslide = -uVar3;
      break;
    case 7:
      channel_00->xm_volslide = uVar3;
      break;
    case 8:
      channel_00->volume = channel_00->volume - uVar3;
      if (0x40 < channel_00->volume) {
        channel_00->volume = '\0';
      }
      break;
    case 9:
      channel_00->volume = channel_00->volume + uVar3;
      if (0x40 < channel_00->volume) {
        channel_00->volume = '@';
      }
      break;
    case 10:
      if ((bVar1 & 0xf) != 0) {
        channel_00->lastHspeed = uVar3;
      }
      if (channel_00->playing != (IT_PLAYING *)0x0) {
        channel_00->playing->vibrato_speed = channel_00->lastHspeed;
      }
      break;
    case 0xb:
      if ((bVar1 & 0xf) != 0) {
        channel_00->lastHdepth = (uchar)(uVar4 << 2);
      }
      if (channel_00->playing != (IT_PLAYING *)0x0) {
        channel_00->playing->vibrato_depth = channel_00->lastHdepth;
        channel_00->playing->vibrato_speed = channel_00->lastHspeed;
        channel_00->playing->vibrato_n = channel_00->playing->vibrato_n + '\x01';
      }
      break;
    case 0xc:
      channel_00->truepan = (short)uVar4 * 0x440 + 0x20;
      break;
    case 0xd:
      if ((bVar1 & 0xf) == 0) {
        cVar6 = -0x80;
      }
      else {
        cVar6 = -uVar3;
      }
      channel_00->panslide = cVar6;
      break;
    case 0xe:
      channel_00->panslide = uVar3;
      break;
    case 0xf:
      break;
    default:
      channel_00->volume = in_RSI[4] - 0x10;
    }
  }
  if (local_28 != (IT_PLAYING *)0x0) {
    free_playing(in_RDI,local_28);
  }
  return;
}

Assistant:

static void process_xm_note_data(DUMB_IT_SIGRENDERER *sigrenderer, IT_ENTRY *entry)
{
	DUMB_IT_SIGDATA *sigdata = sigrenderer->sigdata;
	IT_CHANNEL *channel = &sigrenderer->channel[(int)entry->channel];
	IT_PLAYING * playing = NULL;

	if (entry->mask & IT_ENTRY_INSTRUMENT) {
		int oldsample = channel->sample;
		channel->inv_loop_offset = 0;
		channel->instrument = entry->instrument;
		instrument_to_sample(sigdata, channel);
		if (channel->playing &&
			!((entry->mask & IT_ENTRY_NOTE) && entry->note >= 120) &&
			!((entry->mask & IT_ENTRY_EFFECT) && entry->effect == IT_XM_KEY_OFF && entry->effectvalue == 0)) {
			playing = dup_playing(channel->playing, channel, channel);
			if (!playing) return;
			if (!(sigdata->flags & IT_WAS_A_MOD)) {
				/* Retrigger vol/pan envelopes if enabled, and cancel fadeout.
				 * Also reset vol/pan to that of _original_ instrument.
				 */
				channel->playing->flags &= ~(IT_PLAYING_SUSTAINOFF | IT_PLAYING_FADING);
				it_playing_update_resamplers(channel->playing);

				channel->volume = channel->playing->sample->default_volume;
				channel->truepan = 32 + channel->playing->sample->default_pan*64;

				retrigger_xm_envelopes(channel->playing);
			} else {
				/* Switch if sample changed */
				if (oldsample != channel->sample) {
					int i;
					for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
						if (!sigrenderer->playing[i]) {
							channel->playing->declick_stage = 3;
							sigrenderer->playing[i] = channel->playing;
							channel->playing = NULL;
							break;
						}
					}

					if (!channel->sample) {
						if (channel->playing)
						{
							free_playing(sigrenderer, channel->playing);
							channel->playing = NULL;
						}
					} else {
						if (channel->playing) {
							free_playing(sigrenderer, channel->playing);
						}
						channel->playing = playing;
						playing = NULL;
						channel->playing->declick_stage = 0;
						channel->playing->sampnum = channel->sample;
						channel->playing->sample = &sigdata->sample[channel->sample-1];
						it_playing_reset_resamplers(channel->playing, 0);
					}
				}
				get_default_volpan(sigdata, channel);
			}
		}
	}

	if (!((entry->mask & IT_ENTRY_EFFECT) && entry->effect == IT_XM_KEY_OFF && entry->effectvalue == 0) &&
		(entry->mask & IT_ENTRY_NOTE))
	{
		if (!(entry->mask & IT_ENTRY_INSTRUMENT))
			instrument_to_sample(sigdata, channel);

		if (channel->note >= 120)
			xm_note_off(sigdata, channel);
		else if (channel->sample == 0) {
			/** If we get here, one of the following is the case:
			 ** 1. The instrument has never been specified on this channel.
			 ** 2. The specified instrument is invalid.
			 ** 3. The instrument has no sample mapped to the selected note.
			 ** What should happen?
			 **
			 ** Experimentation shows that any existing note stops and cannot
			 ** be brought back. A subsequent instrument change fixes that.
			 **/
			if (channel->playing) {
				int i;
				if (playing) {
					free_playing(sigrenderer, channel->playing);
					channel->playing = playing;
					playing = NULL;
				}
				for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
					if (!sigrenderer->playing[i]) {
						channel->playing->declick_stage = 3;
						sigrenderer->playing[i] = channel->playing;
						channel->playing = NULL;
						break;
					}
				}
				if (channel->playing) {
					free_playing(sigrenderer, channel->playing);
					channel->playing = NULL;
				}
			}
			if (playing) free_playing(sigrenderer, playing);
			return;
		} else if (channel->playing && (entry->mask & IT_ENTRY_VOLPAN) && ((entry->volpan>>4) == 0xF)) {
			/* Don't retrigger note; portamento in the volume column. */
		} else if (channel->playing &&
		           (entry->mask & IT_ENTRY_EFFECT) &&
		           (entry->effect == IT_TONE_PORTAMENTO ||
		            entry->effect == IT_VOLSLIDE_TONEPORTA)) {
			/* Don't retrigger note; portamento in the effects column. */
		} else {
			channel->destnote = IT_NOTE_OFF;

			if (!channel->playing) {
				channel->playing = new_playing(sigrenderer);
				if (!channel->playing) {
					if (playing) free_playing(sigrenderer, playing);
					return;
				}
				// Adding the following seems to do the trick for the case where a piece starts with an instrument alone and then some notes alone.
				retrigger_xm_envelopes(channel->playing);
			}
			else if (playing) {
				/* volume rampy stuff! move note to NNA */
				int i;
				IT_PLAYING * ptemp;
				if (playing->sample) ptemp = playing;
				else ptemp = channel->playing;
				if (!ptemp) {
					if (playing) free_playing(sigrenderer, playing);
					return;
				}
				playing = NULL;
				for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
					if (!sigrenderer->playing[i]) {
						ptemp->declick_stage = 3;
						ptemp->flags |= IT_PLAYING_SUSTAINOFF | IT_PLAYING_FADING;
						sigrenderer->playing[i] = ptemp;
						ptemp = NULL;
						break;
					}
				}
				if (ptemp) free_playing(sigrenderer, ptemp);
			}

			channel->playing->flags = 0;
			channel->playing->resampling_quality = sigrenderer->resampling_quality;
			channel->playing->channel = channel;
			channel->playing->sample = &sigdata->sample[channel->sample-1];
			if (sigdata->flags & IT_USE_INSTRUMENTS)
				channel->playing->instrument = &sigdata->instrument[channel->instrument-1];
			else
				channel->playing->instrument = NULL;
			channel->playing->env_instrument = channel->playing->instrument;
			channel->playing->sampnum = channel->sample;
			channel->playing->instnum = channel->instrument;
			channel->playing->declick_stage = 0;
			channel->playing->channel_volume = channel->channelvolume;
			channel->playing->note = channel->truenote;
			channel->playing->enabled_envelopes = 0;
			channel->playing->volume_offset = 0;
			channel->playing->panning_offset = 0;
			//channel->playing->output = channel->output;
			if (sigdata->flags & IT_USE_INSTRUMENTS) {
				IT_PLAYING * playing = channel->playing;
				IT_INSTRUMENT * instrument = playing->instrument;
				if (instrument->volume_envelope.flags & IT_ENVELOPE_ON) playing->enabled_envelopes |= IT_ENV_VOLUME;
				if (instrument->pan_envelope.flags & IT_ENVELOPE_ON) playing->enabled_envelopes |= IT_ENV_PANNING;
				//if (instrument->output) playing->output = instrument->output;
			}
			channel->playing->filter_cutoff = 127;
			channel->playing->filter_resonance = 0;
			channel->playing->true_filter_cutoff = 127 << 8;
			channel->playing->true_filter_resonance = 0;
			channel->playing->vibrato_speed = 0;
			channel->playing->vibrato_depth = 0;
			channel->playing->vibrato_n = 0;
			channel->playing->vibrato_time = 0;
			channel->playing->vibrato_waveform = 0;
			channel->playing->tremolo_speed = 0;
			channel->playing->tremolo_depth = 0;
			channel->playing->tremolo_time = 0;
			channel->playing->tremolo_waveform = 0;
			channel->playing->panbrello_speed = 0;
			channel->playing->panbrello_depth = 0;
			channel->playing->panbrello_time = 0;
			channel->playing->panbrello_waveform = 0;
			channel->playing->panbrello_random = 0;
			channel->playing->sample_vibrato_time = 0;
			channel->playing->sample_vibrato_waveform = channel->playing->sample->vibrato_waveform;
			channel->playing->sample_vibrato_depth = 0;
			channel->playing->slide = 0;
			channel->playing->finetune = channel->playing->sample->finetune;
			it_reset_filter_state(&channel->playing->filter_state[0]); // Are these
			it_reset_filter_state(&channel->playing->filter_state[1]); // necessary?
			it_playing_reset_resamplers(channel->playing, 0);

			/** WARNING - is everything initialised? */
		}
	}

	if (!((entry->mask & IT_ENTRY_EFFECT) && entry->effect == IT_XM_KEY_OFF && entry->effectvalue == 0) &&
		!((entry->mask & IT_ENTRY_NOTE) && entry->note >= 120) &&
		(entry->mask & (IT_ENTRY_NOTE | IT_ENTRY_INSTRUMENT)) == (IT_ENTRY_NOTE | IT_ENTRY_INSTRUMENT))
	{
		if (channel->playing) retrigger_xm_envelopes(channel->playing);
		get_default_volpan(sigdata, channel);
	}

	if ((entry->mask & IT_ENTRY_VOLPAN) && ((entry->volpan>>4) == 0xF)) {
		/* Tone Portamento */
		unsigned char v = (entry->volpan & 15) << 4;
		if (v == 0)
			v = channel->lastG;
		channel->lastG = v;
		if (entry->mask & IT_ENTRY_NOTE)
			if (channel->sample && channel->note < 120)
				channel->destnote = channel->truenote;
		channel->toneporta = v << 4;
	} else if ((entry->mask & IT_ENTRY_EFFECT) &&
	           (entry->effect == IT_TONE_PORTAMENTO ||
	            entry->effect == IT_VOLSLIDE_TONEPORTA)) {
		unsigned char v;
		if (entry->effect == IT_TONE_PORTAMENTO)
			v = entry->effectvalue;
		else
			v = 0;
		if (v == 0)
			v = channel->lastG;
		channel->lastG = v;
		if (entry->mask & IT_ENTRY_NOTE)
			if (channel->sample && channel->note < 120)
				channel->destnote = channel->truenote;
		channel->toneporta = v << 4;
	}

	if (entry->mask & IT_ENTRY_VOLPAN) {
		int effect = entry->volpan >> 4;
		int value  = entry->volpan & 15;
		switch (effect) {
			case 0x6: /* Volume slide down */
				channel->xm_volslide = -value;
				break;
			case 0x7: /* Volume slide up */
				channel->xm_volslide = value;
				break;
			case 0x8: /* Fine volume slide down */
				channel->volume -= value;
				if (channel->volume > 64) channel->volume = 0;
				break;
			case 0x9: /* Fine volume slide up */
				channel->volume += value;
				if (channel->volume > 64) channel->volume = 64;
				break;
			case 0xA: /* Set vibrato speed */
				if (value)
					channel->lastHspeed = value;
				if (channel->playing)
					channel->playing->vibrato_speed = channel->lastHspeed;
				break;
			case 0xB: /* Vibrato */
				if (value)
					channel->lastHdepth = value << 2; /** WARNING: correct ? */
				if (channel->playing) {
					channel->playing->vibrato_depth = channel->lastHdepth;
					channel->playing->vibrato_speed = channel->lastHspeed;
					channel->playing->vibrato_n++;
				}
				break;
			case 0xC: /* Set panning */
				channel->truepan = 32 + value*(17*64);
				break;
			case 0xD: /* Pan slide left */
				/* -128 is a special case for emulating a 'feature' in FT2.
				 * As soon as effects are processed, it goes hard left.
				 */
				channel->panslide = value ? -value : -128;
				break;
			case 0xE: /* Pan slide Right */
				channel->panslide = value;
				break;
			case 0xF: /* Tone porta */
				break;
			default:  /* Volume */
				channel->volume = entry->volpan - 0x10;
				break;
		}
	}

	if (playing) free_playing(sigrenderer, playing);
}